

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_functs.hpp
# Opt level: O0

bool Limonp::splitStr(string *src,
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *res,string *pattern)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  ulong in_RDX;
  value_type *in_RSI;
  string *in_RDI;
  size_t end;
  size_t start;
  value_type *in_stack_ffffffffffffff18;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff20;
  allocator *this;
  allocator local_a1;
  string local_a0 [32];
  string local_80 [48];
  string local_50 [32];
  long local_30;
  ulong local_28;
  ulong local_20;
  value_type *local_18;
  string *local_10;
  bool local_1;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0x13142c);
    local_30 = 0;
    local_28 = 0;
    while (uVar2 = local_28, uVar3 = std::__cxx11::string::size(), uVar2 < uVar3) {
      local_30 = std::__cxx11::string::find_first_of(local_10,local_20);
      if (local_30 == -1) {
        std::__cxx11::string::substr((ulong)local_50,(ulong)local_10);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
        std::__cxx11::string::~string(local_50);
        return true;
      }
      std::__cxx11::string::substr((ulong)local_80,(ulong)local_10);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      std::__cxx11::string::~string(local_80);
      lVar1 = local_30;
      lVar4 = std::__cxx11::string::size();
      if (lVar1 == lVar4 + -1) {
        this = &local_a1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_a0,"",this);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)this,local_18);
        std::__cxx11::string::~string(local_a0);
        std::allocator<char>::~allocator((allocator<char> *)&local_a1);
        break;
      }
      local_28 = local_30 + 1;
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

inline bool splitStr(const string& src, vector<string>& res, const string& pattern)
    {
        if(src.empty())
        {
            return false;
        }
        res.clear();

        size_t start = 0;
        size_t end = 0;
        while(start < src.size())
        {
            end = src.find_first_of(pattern, start);
            if(string::npos == end)
            {
                res.push_back(src.substr(start));
                return true;
            }
            res.push_back(src.substr(start, end - start));
            if(end == src.size() - 1)
            {
                res.push_back("");
                break;
            }
            start = end + 1;
        }
        return true;
    }